

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_pcode.cpp
# Opt level: O3

void __thiscall PcodeGenerator::MergeSelfAssign(PcodeGenerator *this)

{
  vector<Pcode,_std::allocator<Pcode>_> *this_00;
  PcodeType PVar1;
  pointer pcVar2;
  pointer pPVar3;
  _Alloc_hider _Var4;
  undefined1 *puVar5;
  bool bVar6;
  int iVar7;
  iterator iter;
  iterator __position;
  Pcode *pPVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  string num1;
  int local_7c;
  undefined1 *local_70;
  size_t local_68;
  undefined1 local_60 [16];
  string local_50;
  
  this_00 = &this->m_pcode_queue;
  pPVar8 = (this->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    __position._M_current =
         (this_00->super__Vector_base<Pcode,_std::allocator<Pcode>_>)._M_impl.
         super__Vector_impl_data._M_start;
    bVar6 = true;
    if ((long)pPVar8 - (long)__position._M_current != 0x88) {
      uVar9 = 0;
      local_7c = 0;
      iVar11 = 0;
      do {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar2 = __position._M_current[uVar9].m_num1._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar2,
                   pcVar2 + __position._M_current[uVar9].m_num1._M_string_length);
        iVar10 = iVar11 + 1;
        pPVar3 = (this_00->super__Vector_base<Pcode,_std::allocator<Pcode>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        _Var4._M_p = pPVar3[iVar10].m_num2._M_dataplus._M_p;
        local_70 = local_60;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,_Var4._M_p,
                   _Var4._M_p + pPVar3[iVar10].m_num2._M_string_length);
        puVar5 = local_70;
        if ((local_50._M_string_length == local_68) &&
           ((local_50._M_string_length == 0 ||
            (iVar7 = bcmp(local_50._M_dataplus._M_p,local_70,local_50._M_string_length), iVar7 == 0)
            ))) {
          PVar1 = (this_00->super__Vector_base<Pcode,_std::allocator<Pcode>_>)._M_impl.
                  super__Vector_impl_data._M_start[iVar10].m_op;
          if (puVar5 != local_60) {
            operator_delete(puVar5);
          }
          if (PVar1 == ASSIGN) {
            bVar6 = GlobalJudge(&local_50);
            if ((!bVar6) && (bVar6 = FPJudge(&local_50), !bVar6)) {
              pPVar3 = (this_00->super__Vector_base<Pcode,_std::allocator<Pcode>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              _Var4._M_p = pPVar3[iVar10].m_num1._M_dataplus._M_p;
              local_70 = local_60;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_70,_Var4._M_p,
                         _Var4._M_p + pPVar3[iVar10].m_num1._M_string_length);
              std::__cxx11::string::_M_assign((string *)&pPVar3[uVar9].m_num1);
              if (local_70 != local_60) {
                operator_delete(local_70);
              }
              (this_00->super__Vector_base<Pcode,_std::allocator<Pcode>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar10].m_op = NOP;
              local_7c = local_7c + 1;
              iVar11 = iVar10;
            }
          }
        }
        else if (puVar5 != local_60) {
          operator_delete(puVar5);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        iVar11 = iVar11 + 1;
        uVar9 = (ulong)iVar11;
        __position._M_current =
             (this->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
             super__Vector_impl_data._M_start;
        pPVar8 = (this->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      } while (uVar9 < ((long)pPVar8 - (long)__position._M_current >> 3) * -0xf0f0f0f0f0f0f0f - 1U);
      bVar6 = local_7c == 0;
    }
    while (__position._M_current != pPVar8) {
      if ((__position._M_current)->m_op == NOP) {
        __position = std::vector<Pcode,_std::allocator<Pcode>_>::_M_erase(this_00,__position);
        pPVar8 = (this->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      else {
        __position._M_current = __position._M_current + 1;
      }
    }
  } while (!bVar6);
  return;
}

Assistant:

void PcodeGenerator::MergeSelfAssign() {
    int count;
    do {
        count = 0;
        for (int i=0; i<m_pcode_queue.size()-1; ++i) {
            string num1 = m_pcode_queue[i].GetNum1();
            if (num1 == m_pcode_queue[i+1].GetNum2() && m_pcode_queue[i+1].GetOP() == ASSIGN) {
                if (GlobalJudge(num1) || FPJudge(num1))
                    continue;
                m_pcode_queue[i].SetNum1(m_pcode_queue[i+1].GetNum1());
                m_pcode_queue[i+1].SetOP(NOP);
                i++;
                count++;
            }
        }
        for (auto iter = m_pcode_queue.begin(); iter != m_pcode_queue.end();) {
            if (iter->GetOP() == NOP) {
                iter = m_pcode_queue.erase(iter);
            } else {
                iter++;
            }
        }
    } while (count != 0);
}